

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<bool_const&,bool_const&,pstd::optional<int>const&,pstd::optional<int>const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&,pstd::optional<pbrt::Point2<int>>const&,float_const&>
               (string *s,char *fmt,bool *v,bool *args,optional<int> *args_1,optional<int> *args_2,
               bool *args_3,bool *args_4,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_7,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_8,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_9,
               optional<pbrt::Bounds2<float>_> *args_10,optional<pbrt::Bounds2<int>_> *args_11,
               optional<pbrt::Point2<int>_> *args_12,float *args_13)

{
  long lVar1;
  ulong uVar2;
  string *in_RCX;
  byte *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_RBP;
  char *pcVar3;
  string *in_RDI;
  char *in_R8;
  optional<int> *in_R9;
  bool *unaff_R15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  string *in_stack_00000018;
  optional<pbrt::Bounds2<float>_> *in_stack_00000020;
  string *in_stack_00000028;
  optional<pbrt::Point2<int>_> *in_stack_00000030;
  optional<int> *in_stack_00000038;
  bool *in_stack_00000040;
  bool *in_stack_00000048;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000050;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000058;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string *in_stack_fffffffffffffcd0;
  char **in_stack_fffffffffffffcd8;
  char **in_stack_fffffffffffffce0;
  char *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  optional<pbrt::Bounds2<float>_> *in_stack_fffffffffffffd20;
  optional<pbrt::Bounds2<int>_> *in_stack_fffffffffffffd28;
  string *psVar4;
  optional<pbrt::Point2<int>_> *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd64;
  char *in_stack_fffffffffffffd68;
  LogLevel in_stack_fffffffffffffd74;
  string local_288 [32];
  undefined8 local_268;
  string local_260 [32];
  stringstream local_240 [16];
  undefined1 local_230 [376];
  string local_b8 [32];
  undefined4 local_98;
  undefined1 local_83;
  byte local_82;
  byte local_81;
  string local_80 [8];
  bool *in_stack_ffffffffffffff88;
  optional<int> *in_stack_ffffffffffffff90;
  optional<int> *in_stack_ffffffffffffff98;
  
  copyToFormatString(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  lVar1 = std::__cxx11::string::find((char)local_80,0x2a);
  local_81 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_80,0x73);
  local_82 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_80,100);
  local_83 = lVar1 != -1;
  if ((local_81 & 1) == 0) {
    if ((local_82 & 1) == 0) {
      if ((bool)local_83) {
        psVar4 = local_80;
        uVar2 = std::__cxx11::string::find((char)psVar4,100);
        IntegerFormatTrait<bool>::fmt();
        std::__cxx11::string::replace((ulong)psVar4,uVar2,(char *)0x1);
        std::__cxx11::string::c_str();
        formatOne<bool_const&>(in_stack_fffffffffffffce8,(bool *)in_stack_fffffffffffffce0);
        std::__cxx11::string::operator+=(in_RDI,local_b8);
        std::__cxx11::string::~string(local_b8);
      }
      else if ((local_82 & 1) == 0) {
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) != 0) {
          LogFatal(in_stack_fffffffffffffd74,in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,
                   in_stack_fffffffffffffd58);
        }
        std::__cxx11::string::c_str();
        formatOne<bool_const&>(in_stack_fffffffffffffce8,(bool *)in_stack_fffffffffffffce0);
        std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd58);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffd58);
      }
      else {
        std::__cxx11::stringstream::stringstream(local_240);
        std::ostream::operator<<(local_230,(bool)(*in_RDX & 1));
        std::__cxx11::string::c_str();
        std::__cxx11::stringstream::str();
        local_268 = std::__cxx11::string::c_str();
        formatOne<char_const*>(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
        std::__cxx11::string::operator+=(in_RDI,local_260);
        std::__cxx11::string::~string(local_260);
        std::__cxx11::string::~string(local_288);
        std::__cxx11::stringstream::~stringstream(local_240);
      }
    }
    else {
      pcVar3 = "false";
      if ((*in_RDX & 1) != 0) {
        pcVar3 = "true";
      }
      std::__cxx11::string::operator+=(in_RDI,pcVar3);
    }
    stringPrintfRecursive<bool_const&,pstd::optional<int>const&,pstd::optional<int>const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&,pstd::optional<pbrt::Point2<int>>const&,float_const&>
              (in_RCX,in_R8,(bool *)in_R9,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88,unaff_R15,unaff_RBP,unaff_retaddr,in_stack_00000008,
               in_stack_00000010,in_stack_00000018,in_stack_00000020,
               (optional<pbrt::Bounds2<int>_> *)in_stack_00000028,in_stack_00000030,
               (float *)in_stack_00000038);
    local_98 = 0;
  }
  else {
    stringPrintfRecursiveWithPrecision<bool_const&,bool_const&,pstd::optional<int>const&,pstd::optional<int>const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&,pstd::optional<pbrt::Point2<int>>const&,float_const&>
              (in_stack_00000028,(char *)in_stack_00000020,in_stack_00000018,
               (bool *)in_stack_00000010,(bool *)in_stack_00000008,in_R9,in_stack_00000038,
               in_stack_00000040,in_stack_00000048,in_stack_00000050,in_stack_00000058,
               in_stack_fffffffffffffd08,in_stack_fffffffffffffd10,in_stack_fffffffffffffd18,
               in_stack_fffffffffffffd20,in_stack_fffffffffffffd28,in_stack_fffffffffffffd30,
               (float *)&stack0xfffffffffffffca8);
    local_98 = 1;
  }
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}